

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_global_init_mem
                   (long flags,curl_malloc_callback m,curl_free_callback f,curl_realloc_callback r,
                   curl_strdup_callback s,curl_calloc_callback c)

{
  undefined4 in_EAX;
  int iVar1;
  CURLcode CVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(m == (curl_malloc_callback)0x0);
  auVar3._4_4_ = -(uint)(f == (curl_free_callback)0x0);
  auVar3._8_4_ = -(uint)(r == (curl_realloc_callback)0x0);
  auVar3._12_4_ = -(uint)(s == (curl_strdup_callback)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  CVar2 = CURLE_FAILED_INIT;
  if (iVar1 == 0 && c != (curl_calloc_callback)0x0) {
    if (initialized == 0) {
      Curl_cmalloc = m;
      Curl_cfree = f;
      Curl_crealloc = r;
      Curl_cstrdup = s;
      Curl_ccalloc = c;
      CVar2 = global_init(0,SUB81(m,0));
      return CVar2;
    }
    initialized = initialized + 1;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode curl_global_init_mem(long flags, curl_malloc_callback m,
                              curl_free_callback f, curl_realloc_callback r,
                              curl_strdup_callback s, curl_calloc_callback c)
{
  /* Invalid input, return immediately */
  if(!m || !f || !r || !s || !c)
    return CURLE_FAILED_INIT;

  if(initialized) {
    /* Already initialized, don't do it again, but bump the variable anyway to
       work like curl_global_init() and require the same amount of cleanup
       calls. */
    initialized++;
    return CURLE_OK;
  }

  /* set memory functions before global_init() in case it wants memory
     functions */
  Curl_cmalloc = m;
  Curl_cfree = f;
  Curl_cstrdup = s;
  Curl_crealloc = r;
  Curl_ccalloc = c;

  /* Call the actual init function, but without setting */
  return global_init(flags, FALSE);
}